

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_pre_g_table(secp256k1_ge_storage *pre_g,size_t n)

{
  int *piVar1;
  uint64_t uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  uint64_t uVar123;
  uint64_t uVar124;
  uint64_t uVar125;
  uint64_t uVar126;
  uint64_t uVar127;
  uint64_t uVar128;
  uint64_t uVar129;
  uint64_t uVar130;
  uint64_t uVar131;
  int iVar132;
  ulong uVar133;
  ulong uVar134;
  secp256k1_ge *psVar135;
  ulong uVar136;
  ulong uVar137;
  ulong uVar138;
  byte bVar139;
  long lVar140;
  uint extraout_EDX;
  ulong uVar141;
  ulong uVar142;
  ulong uVar143;
  ulong uVar144;
  ulong uVar145;
  secp256k1_ge_storage *psVar146;
  secp256k1_ge_storage *psVar147;
  ulong uVar148;
  secp256k1_ge *psVar149;
  ulong uVar150;
  ulong uVar151;
  uint uVar152;
  ulong uVar153;
  uint uVar154;
  ulong uVar155;
  ulong uVar156;
  uint uVar157;
  ulong uVar158;
  ulong uVar159;
  ulong uVar160;
  byte bVar161;
  secp256k1_fe dqy;
  secp256k1_fe dpy;
  secp256k1_fe dpx;
  secp256k1_ge p;
  secp256k1_gej g2;
  secp256k1_fe dqx;
  secp256k1_ge gg;
  secp256k1_ge q;
  long local_298;
  undefined1 local_290 [48];
  ulong uStack_260;
  secp256k1_ge *local_258;
  ulong uStack_250;
  ulong local_248;
  undefined1 local_238 [88];
  secp256k1_ge local_1e0;
  secp256k1_gej local_188;
  secp256k1_fe local_108;
  secp256k1_ge local_e0;
  secp256k1_ge local_88;
  
  bVar161 = 0;
  psVar135 = &local_1e0;
  local_238._80_8_ = pre_g;
  secp256k1_ge_from_storage(psVar135,pre_g);
  iVar132 = secp256k1_ge_is_valid_var(psVar135);
  if (iVar132 != 0) {
    local_188.infinity = local_1e0.infinity;
    local_188.x.n[0] = local_1e0.x.n[0];
    local_188.x.n[1] = local_1e0.x.n[1];
    local_188.x.n[2] = local_1e0.x.n[2];
    local_188.x.n[3] = local_1e0.x.n[3];
    local_188.x.n[4] = local_1e0.x.n[4];
    local_188.y.n[0] = local_1e0.y.n[0];
    local_188.y.n[1] = local_1e0.y.n[1];
    local_188.y.n[2] = local_1e0.y.n[2];
    local_188.y.n[3] = local_1e0.y.n[3];
    local_188.y.n[4] = local_1e0.y.n[4];
    local_188.z.n[0] = 1;
    local_188.z.n[1] = 0;
    local_188.z.n[2] = 0;
    local_188.z.n[3] = 0;
    local_188.z.n[4] = 0;
    if (local_1e0.infinity == 0) {
      secp256k1_gej_double(&local_188,&local_188);
    }
    else {
      local_188.infinity = 1;
      local_188.x.n[0] = 0;
      local_188.x.n[1] = 0;
      local_188.x.n[2] = 0;
      local_188.x.n[3] = 0;
      local_188.x.n[4] = 0;
      local_188.y.n[0] = 0;
      local_188.y.n[1] = 0;
      local_188.y.n[2] = 0;
      local_188.y.n[3] = 0;
      local_188.y.n[4] = 0;
      local_188.z.n[0] = 0;
      local_188.z.n[1] = 0;
      local_188.z.n[2] = 0;
      local_188.z.n[3] = 0;
      local_188.z.n[4] = 0;
    }
    secp256k1_ge_set_gej_var(&local_e0,&local_188);
    local_298 = 0x40;
    while( true ) {
      uVar131 = local_e0.y.n[4];
      uVar130 = local_e0.y.n[3];
      uVar129 = local_e0.y.n[2];
      uVar128 = local_e0.y.n[1];
      uVar127 = local_e0.y.n[0];
      uVar126 = local_e0.x.n[4];
      uVar125 = local_e0.x.n[3];
      uVar124 = local_e0.x.n[2];
      uVar123 = local_e0.x.n[1];
      uVar2 = local_e0.x.n[0];
      uVar133 = (0x3fffffffffffc - local_1e0.x.n[4]) + local_e0.x.n[4];
      uVar156 = (uVar133 >> 0x30) * 0x1000003d1 +
                (0x3ffffbfffff0bc - local_1e0.x.n[0]) + local_e0.x.n[0];
      uVar155 = (uVar156 >> 0x34) + (0x3ffffffffffffc - local_1e0.x.n[1]) + local_e0.x.n[1];
      uVar159 = (uVar155 >> 0x34) + (0x3ffffffffffffc - local_1e0.x.n[2]) + local_e0.x.n[2];
      uVar148 = (uVar159 >> 0x34) + (0x3ffffffffffffc - local_1e0.x.n[3]) + local_e0.x.n[3];
      psVar146 = (secp256k1_ge_storage *)((uVar148 >> 0x34) + (uVar133 & 0xffffffffffff));
      uVar133 = (0x3fffffffffffc - local_1e0.y.n[4]) + local_e0.y.n[4];
      uVar158 = (uVar133 >> 0x30) * 0x1000003d1 +
                (0x3ffffbfffff0bc - local_1e0.y.n[0]) + local_e0.y.n[0];
      uVar145 = (uVar158 >> 0x34) + (0x3ffffffffffffc - local_1e0.y.n[1]) + local_e0.y.n[1];
      uVar143 = (uVar145 >> 0x34) + (0x3ffffffffffffc - local_1e0.y.n[2]) + local_e0.y.n[2];
      uVar141 = (uVar143 >> 0x34) + (0x3ffffffffffffc - local_1e0.y.n[3]) + local_e0.y.n[3];
      uVar133 = (uVar141 >> 0x34) + (uVar133 & 0xffffffffffff);
      uVar156 = uVar156 & 0xfffffffffffff;
      uVar155 = uVar155 & 0xfffffffffffff;
      uVar159 = uVar159 & 0xfffffffffffff;
      uVar148 = uVar148 & 0xfffffffffffff;
      uVar158 = uVar158 & 0xfffffffffffff;
      uVar145 = uVar145 & 0xfffffffffffff;
      uVar143 = uVar143 & 0xfffffffffffff;
      uVar141 = uVar141 & 0xfffffffffffff;
      pre_g = psVar146;
      local_238._0_8_ = uVar158;
      local_238._8_8_ = uVar145;
      local_238._16_8_ = uVar143;
      local_238._24_8_ = uVar141;
      local_238._32_8_ = uVar133;
      local_238._40_8_ = uVar156;
      local_238._48_8_ = uVar155;
      local_238._56_8_ = uVar159;
      local_238._64_8_ = uVar148;
      local_238._72_8_ = psVar146;
      iVar132 = secp256k1_fe_impl_normalizes_to_zero_var((secp256k1_fe *)(local_238 + 0x28));
      if (iVar132 != 0) break;
LAB_00169bde:
      pre_g = (secp256k1_ge_storage *)
              ((long)((secp256k1_fe_storage *)local_238._80_8_)->n + local_298);
      psVar149 = &local_88;
      secp256k1_ge_from_storage(psVar149,pre_g);
      iVar132 = secp256k1_ge_is_valid_var(psVar149);
      if (iVar132 == 0) {
        test_pre_g_table_cold_5();
LAB_0016a78a:
        test_pre_g_table_cold_4();
        goto LAB_0016a78f;
      }
      uVar142 = (0x3ffffbfffff0bc - local_88.x.n[0]) + uVar2;
      psVar147 = (secp256k1_ge_storage *)((0x3ffffffffffffc - local_88.x.n[1]) + uVar123);
      uVar151 = (0x3ffffffffffffc - local_88.x.n[2]) + uVar124;
      uVar160 = (0x3ffffffffffffc - local_88.x.n[3]) + uVar125;
      uVar150 = (0x3fffffffffffc - local_88.x.n[4]) + uVar126;
      uVar144 = uVar127 + local_88.y.n[0];
      uVar134 = uVar128 + local_88.y.n[1];
      psVar135 = (secp256k1_ge *)(uVar129 + local_88.y.n[2]);
      uVar136 = uVar130 + local_88.y.n[3];
      uVar137 = uVar131 + local_88.y.n[4];
      pre_g = psVar147;
      local_290._40_8_ = uVar144;
      uStack_260 = uVar134;
      local_258 = psVar135;
      uStack_250 = uVar136;
      local_248 = uVar137;
      local_108.n[0] = uVar142;
      local_108.n[1] = (uint64_t)psVar147;
      local_108.n[2] = uVar151;
      local_108.n[3] = uVar160;
      local_108.n[4] = uVar150;
      iVar132 = secp256k1_fe_impl_normalizes_to_zero_var(&local_108);
      if (iVar132 != 0) {
        psVar149 = (secp256k1_ge *)(local_290 + 0x28);
        iVar132 = secp256k1_fe_impl_normalizes_to_zero_var((secp256k1_fe *)psVar149);
        if (iVar132 == 0) goto LAB_00169d82;
        goto LAB_0016a794;
      }
LAB_00169d82:
      local_290._0_8_ = (0x3ffffbfffff0bc - uVar156) + uVar142;
      local_290._8_8_ = (0x3ffffffffffffc - uVar155) + (long)psVar147;
      local_290._16_8_ = (0x3ffffffffffffc - uVar159) + uVar151;
      local_290._24_8_ = (0x3ffffffffffffc - uVar148) + uVar160;
      local_290._32_8_ = (0x3fffffffffffc - (long)psVar146) + uVar150;
      iVar132 = secp256k1_fe_impl_normalizes_to_zero((secp256k1_fe *)local_290);
      if (iVar132 != 0) {
        local_290._0_8_ = (0x3ffffbfffff0bc - uVar158) + uVar144;
        local_290._8_8_ = (0x3ffffffffffffc - uVar145) + uVar134;
        local_290._16_8_ = (0x3ffffffffffffc - uVar143) + (long)psVar135;
        local_290._24_8_ = (0x3ffffffffffffc - uVar141) + uVar136;
        local_290._32_8_ = (0x3fffffffffffc - uVar133) + uVar137;
        iVar132 = secp256k1_fe_impl_normalizes_to_zero((secp256k1_fe *)local_290);
        if (iVar132 == 0) goto LAB_00169eda;
        goto LAB_0016a799;
      }
LAB_00169eda:
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar156;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = uVar136;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar155;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = psVar135;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar159;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = uVar134;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar148;
      auVar69._8_8_ = 0;
      auVar69._0_8_ = uVar144;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = psVar146;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = uVar137;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = SUB168(auVar8 * auVar70,0);
      auVar7 = auVar5 * auVar67 + auVar4 * auVar66 + auVar6 * auVar68 + auVar7 * auVar69 +
               auVar9 * ZEXT816(0x1000003d10);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar156;
      auVar71._8_8_ = 0;
      auVar71._0_8_ = uVar137;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar155;
      auVar72._8_8_ = 0;
      auVar72._0_8_ = uVar136;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar159;
      auVar73._8_8_ = 0;
      auVar73._0_8_ = psVar135;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar148;
      auVar74._8_8_ = 0;
      auVar74._0_8_ = uVar134;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = psVar146;
      auVar75._8_8_ = 0;
      auVar75._0_8_ = uVar144;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = SUB168(auVar8 * auVar70,8);
      auVar4 = auVar15 * ZEXT816(0x1000003d10000) +
               auVar13 * auVar74 + auVar12 * auVar73 + auVar11 * auVar72 + auVar10 * auVar71 +
               auVar14 * auVar75 + (auVar7 >> 0x34);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar156;
      auVar76._8_8_ = 0;
      auVar76._0_8_ = uVar144;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar155;
      auVar77._8_8_ = 0;
      auVar77._0_8_ = uVar137;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar159;
      auVar78._8_8_ = 0;
      auVar78._0_8_ = uVar136;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar148;
      auVar79._8_8_ = 0;
      auVar79._0_8_ = psVar135;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = psVar146;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = uVar134;
      auVar5 = auVar20 * auVar80 + auVar19 * auVar79 + auVar18 * auVar78 + auVar17 * auVar77 +
               (auVar4 >> 0x34);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = (auVar5._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar4._6_2_ & 0xf);
      auVar6 = auVar16 * auVar76 + auVar21 * ZEXT816(0x1000003d1);
      uVar138 = auVar6._0_8_;
      uVar153 = auVar6._8_8_;
      local_238._40_8_ = uVar138 & 0xfffffffffffff;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar156;
      auVar81._8_8_ = 0;
      auVar81._0_8_ = uVar134;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar155;
      auVar82._8_8_ = 0;
      auVar82._0_8_ = uVar144;
      auVar116._8_8_ = uVar153 >> 0x34;
      auVar116._0_8_ = uVar153 * 0x1000 | uVar138 >> 0x34;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar159;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = uVar137;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = uVar148;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = uVar136;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = psVar146;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = psVar135;
      auVar5 = auVar26 * auVar85 + auVar25 * auVar84 + auVar24 * auVar83 + (auVar5 >> 0x34);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = auVar5._0_8_ & 0xfffffffffffff;
      auVar116 = auVar27 * ZEXT816(0x1000003d10) + auVar23 * auVar82 + auVar22 * auVar81 + auVar116;
      local_238._48_8_ = auVar116._0_8_ & 0xfffffffffffff;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar156;
      auVar86._8_8_ = 0;
      auVar86._0_8_ = psVar135;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = uVar155;
      auVar87._8_8_ = 0;
      auVar87._0_8_ = uVar134;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = uVar159;
      auVar88._8_8_ = 0;
      auVar88._0_8_ = uVar144;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = uVar148;
      auVar89._8_8_ = 0;
      auVar89._0_8_ = uVar137;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = psVar146;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = uVar136;
      auVar5 = auVar32 * auVar90 + auVar31 * auVar89 + (auVar5 >> 0x34);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = auVar5._0_8_;
      auVar6 = auVar33 * ZEXT816(0x1000003d10) +
               auVar30 * auVar88 + auVar29 * auVar87 + auVar28 * auVar86 + (auVar116 >> 0x34);
      auVar8 = auVar6 >> 0x34;
      auVar119._8_8_ = 0;
      auVar119._0_8_ = auVar8._0_8_;
      local_238._56_8_ = auVar6._0_8_ & 0xfffffffffffff;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = auVar5._8_8_;
      auVar118._8_8_ = auVar8._8_8_;
      auVar118._0_8_ = auVar7._0_8_ & 0xfffffffffffff;
      auVar119 = auVar34 * ZEXT816(0x1000003d10000) + auVar118 + auVar119;
      local_238._64_8_ = auVar119._0_8_;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = uVar160;
      auVar91._8_8_ = 0;
      auVar91._0_8_ = uVar158;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = uVar151;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = uVar145;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = psVar147;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = uVar143;
      local_238._72_8_ =
           (auVar119._8_8_ << 0xc | (ulong)local_238._64_8_ >> 0x34) +
           (auVar4._0_8_ & 0xffffffffffff);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar142;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = uVar141;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = uVar150;
      auVar95._8_8_ = 0;
      auVar95._0_8_ = uVar133;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = SUB168(auVar39 * auVar95,0);
      local_238._64_8_ = local_238._64_8_ & 0xfffffffffffff;
      auVar4 = auVar40 * ZEXT816(0x1000003d10) +
               auVar35 * auVar91 + auVar36 * auVar92 + auVar38 * auVar94 + auVar37 * auVar93;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = uVar150;
      auVar96._8_8_ = 0;
      auVar96._0_8_ = uVar158;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = uVar160;
      auVar97._8_8_ = 0;
      auVar97._0_8_ = uVar145;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = uVar151;
      auVar98._8_8_ = 0;
      auVar98._0_8_ = uVar143;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = psVar147;
      auVar99._8_8_ = 0;
      auVar99._0_8_ = uVar141;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = uVar142;
      auVar100._8_8_ = 0;
      auVar100._0_8_ = uVar133;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = SUB168(auVar39 * auVar95,8);
      auVar5 = auVar46 * ZEXT816(0x1000003d10000) +
               auVar41 * auVar96 +
               auVar42 * auVar97 + auVar43 * auVar98 + auVar45 * auVar100 + auVar44 * auVar99 +
               (auVar4 >> 0x34);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = uVar142;
      auVar101._8_8_ = 0;
      auVar101._0_8_ = uVar158;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = uVar150;
      auVar102._8_8_ = 0;
      auVar102._0_8_ = uVar145;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar160;
      auVar103._8_8_ = 0;
      auVar103._0_8_ = uVar143;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uVar151;
      auVar104._8_8_ = 0;
      auVar104._0_8_ = uVar141;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = psVar147;
      auVar105._8_8_ = 0;
      auVar105._0_8_ = uVar133;
      auVar6 = (auVar5 >> 0x34) +
               auVar51 * auVar105 + auVar50 * auVar104 + auVar49 * auVar103 + auVar48 * auVar102;
      uVar148 = auVar6._0_8_;
      uVar155 = auVar6._8_8_;
      auVar120._8_8_ = uVar155 >> 0x34;
      auVar120._0_8_ = uVar155 * 0x1000 | uVar148 >> 0x34;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = uVar148 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar5._6_2_ & 0xf);
      auVar6 = auVar47 * auVar101 + auVar52 * ZEXT816(0x1000003d1);
      uVar148 = auVar6._0_8_;
      uVar155 = auVar6._8_8_;
      local_238._0_8_ = uVar148 & 0xfffffffffffff;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = psVar147;
      auVar106._8_8_ = 0;
      auVar106._0_8_ = uVar158;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = uVar142;
      auVar107._8_8_ = 0;
      auVar107._0_8_ = uVar145;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = uVar150;
      auVar108._8_8_ = 0;
      auVar108._0_8_ = uVar143;
      auVar117._8_8_ = uVar155 >> 0x34;
      auVar117._0_8_ = uVar155 * 0x1000 | uVar148 >> 0x34;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = uVar160;
      auVar109._8_8_ = 0;
      auVar109._0_8_ = uVar141;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uVar151;
      auVar110._8_8_ = 0;
      auVar110._0_8_ = uVar133;
      auVar120 = auVar55 * auVar108 + auVar57 * auVar110 + auVar56 * auVar109 + auVar120;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = auVar120._0_8_ & 0xfffffffffffff;
      auVar117 = auVar58 * ZEXT816(0x1000003d10) + auVar53 * auVar106 + auVar54 * auVar107 +
                 auVar117;
      local_238._8_8_ = auVar117._0_8_ & 0xfffffffffffff;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = uVar151;
      auVar111._8_8_ = 0;
      auVar111._0_8_ = uVar158;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = psVar147;
      auVar112._8_8_ = 0;
      auVar112._0_8_ = uVar145;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = uVar142;
      auVar113._8_8_ = 0;
      auVar113._0_8_ = uVar143;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = uVar150;
      auVar114._8_8_ = 0;
      auVar114._0_8_ = uVar141;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = uVar160;
      auVar115._8_8_ = 0;
      auVar115._0_8_ = uVar133;
      auVar6 = auVar63 * auVar115 + auVar62 * auVar114 + (auVar120 >> 0x34);
      auVar64._8_8_ = 0;
      auVar64._0_8_ = auVar6._0_8_;
      auVar7 = auVar64 * ZEXT816(0x1000003d10) +
               auVar59 * auVar111 + auVar61 * auVar113 + auVar60 * auVar112 + (auVar117 >> 0x34);
      auVar8 = auVar7 >> 0x34;
      auVar122._8_8_ = 0;
      auVar122._0_8_ = auVar8._0_8_;
      local_238._16_8_ = auVar7._0_8_ & 0xfffffffffffff;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = auVar6._8_8_;
      auVar121._8_8_ = auVar8._8_8_;
      auVar121._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
      auVar122 = auVar65 * ZEXT816(0x1000003d10000) + auVar121 + auVar122;
      local_238._24_8_ = auVar122._0_8_;
      local_238._32_8_ =
           (auVar122._8_8_ << 0xc | (ulong)local_238._24_8_ >> 0x34) +
           (auVar5._0_8_ & 0xffffffffffff);
      local_290._0_8_ = (0x3ffffbfffff0bc - local_238._40_8_) + local_238._0_8_;
      local_290._8_8_ = (0x3ffffffffffffc - local_238._48_8_) + local_238._8_8_;
      psVar149 = (secp256k1_ge *)local_290;
      pre_g = (secp256k1_ge_storage *)((0x3ffffffffffffc - local_238._56_8_) + local_238._16_8_);
      local_238._24_8_ = local_238._24_8_ & 0xfffffffffffff;
      local_290._24_8_ = (0x3ffffffffffffc - local_238._64_8_) + local_238._24_8_;
      local_290._32_8_ = (0x3fffffffffffc - local_238._72_8_) + local_238._32_8_;
      local_290._16_8_ = pre_g;
      iVar132 = secp256k1_fe_impl_normalizes_to_zero((secp256k1_fe *)psVar149);
      if (iVar132 == 0) goto LAB_0016a78a;
      psVar135 = &local_88;
      psVar149 = &local_1e0;
      for (lVar140 = 0xb; lVar140 != 0; lVar140 = lVar140 + -1) {
        (psVar149->x).n[0] = (psVar135->x).n[0];
        psVar135 = (secp256k1_ge *)((long)psVar135 + ((ulong)bVar161 * -2 + 1) * 8);
        psVar149 = (secp256k1_ge *)((long)psVar149 + ((ulong)bVar161 * -2 + 1) * 8);
      }
      local_298 = local_298 + 0x40;
      if (local_298 == 0x80000) {
        return;
      }
    }
    psVar149 = (secp256k1_ge *)local_238;
    iVar132 = secp256k1_fe_impl_normalizes_to_zero_var((secp256k1_fe *)psVar149);
    if (iVar132 == 0) goto LAB_00169bde;
LAB_0016a78f:
    test_pre_g_table_cold_1();
LAB_0016a794:
    psVar135 = psVar149;
    test_pre_g_table_cold_2();
LAB_0016a799:
    test_pre_g_table_cold_3();
  }
  test_pre_g_table_cold_6();
  uVar2 = (pre_g->x).n[0];
  if ((((pre_g->x).n[1] == 0 && (pre_g->x).n[2] == 0) && (pre_g->x).n[3] == 0) && uVar2 == 0) {
    if (-1 < (int)(0x7f / (long)(int)extraout_EDX)) {
      memset(psVar135,0,(0x7f / (long)(int)extraout_EDX & 0xffffffffU) * 4 + 4);
    }
  }
  else {
    uVar154 = (uint)uVar2;
    bVar161 = (byte)extraout_EDX;
    *(uint *)(psVar135->x).n =
         ((uVar154 << (-bVar161 & 0x1f)) >> (-bVar161 & 0x1f)) + (~uVar154 & 1);
    uVar133 = 0x7f / (long)(int)extraout_EDX;
    uVar141 = uVar133 & 0xffffffff;
    uVar154 = 0x80 - (int)uVar133 * extraout_EDX;
    uVar145 = uVar133 & 0xffffffff;
    uVar143 = (ulong)extraout_EDX;
    if (0 < (int)uVar133) {
      uVar133 = uVar145 * uVar143;
      lVar140 = 0;
      uVar141 = uVar145;
      do {
        uVar152 = extraout_EDX;
        if (lVar140 == 0) {
          uVar152 = uVar154;
        }
        uVar155 = uVar133 >> 6 & 0x3ffffff;
        bVar139 = (byte)uVar133 & 0x3f;
        uVar148 = (pre_g->x).n[uVar155];
        if ((uVar152 + (int)uVar133) - 1 >> 6 == (uint)uVar155) {
          uVar157 = (uint)(uVar148 >> bVar139);
        }
        else {
          uVar157 = (uint)(uVar148 >> ((byte)uVar133 & 0x3f)) |
                    (uint)((pre_g->x).n[uVar155 + 1] << (-bVar139 & 0x3f));
        }
        if (uVar157 << (-(char)uVar152 & 0x1fU) != 0) goto LAB_0016a882;
        *(undefined4 *)((long)(psVar135->x).n + uVar141 * 4) = 0;
        lVar140 = lVar140 + 1;
        uVar133 = uVar133 - uVar143;
        bVar3 = 1 < (long)uVar141;
        uVar141 = uVar141 - 1;
      } while (bVar3);
      uVar141 = 0;
    }
LAB_0016a882:
    if (0 < (int)uVar141) {
      uVar148 = 1;
      uVar133 = uVar143;
      do {
        uVar152 = extraout_EDX;
        if (uVar145 == uVar148) {
          uVar152 = uVar154;
        }
        uVar156 = uVar133 >> 6 & 0x3ffffff;
        bVar139 = (byte)uVar133 & 0x3f;
        uVar155 = (pre_g->x).n[uVar156];
        if (((int)uVar133 + uVar152) - 1 >> 6 == (uint)uVar156) {
          uVar155 = uVar155 >> bVar139;
        }
        else {
          uVar155 = uVar155 >> ((byte)uVar133 & 0x3f) |
                    (pre_g->x).n[uVar156 + 1] << (-bVar139 & 0x3f);
        }
        uVar152 = (uint)((int)uVar155 << (-(char)uVar152 & 0x1fU)) >> (-(char)uVar152 & 0x1fU);
        if ((uVar155 & 1) == 0) {
          piVar1 = (int *)((long)(psVar135->x).n + uVar148 * 4 + -4);
          *piVar1 = *piVar1 + (-1 << (bVar161 & 0x1f));
          uVar152 = uVar152 | 1;
        }
        *(uint *)((long)(psVar135->x).n + uVar148 * 4) = uVar152;
        if ((1 < uVar148) &&
           (((iVar132 = *(int *)((long)(psVar135->x).n + uVar148 * 4 + -4), iVar132 == 1 &&
             (*(int *)((long)(psVar135->x).n + uVar148 * 4 + -8) < 0)) ||
            ((iVar132 == -1 && (0 < *(int *)((long)(psVar135->x).n + uVar148 * 4 + -8))))))) {
          piVar1 = (int *)((long)(psVar135->x).n + uVar148 * 4 + -8);
          *piVar1 = *piVar1 + ((uint)(iVar132 == 1) * 2 + -1 << (bVar161 & 0x1f));
          *(undefined4 *)((long)(psVar135->x).n + uVar148 * 4 + -4) = 0;
        }
        uVar148 = uVar148 + 1;
        uVar133 = uVar133 + uVar143;
      } while ((int)uVar141 + 1 != uVar148);
    }
  }
  return;
}

Assistant:

static void test_pre_g_table(const secp256k1_ge_storage * pre_g, size_t n) {
    /* Tests the pre_g / pre_g_128 tables for consistency.
     * For independent verification we take a "geometric" approach to verification.
     * We check that every entry is on-curve.
     * We check that for consecutive entries p and q, that p + gg - q = 0 by checking
     *  (1) p, gg, and -q are colinear.
     *  (2) p, gg, and -q are all distinct.
     * where gg is twice the generator, where the generator is the first table entry.
     *
     * Checking the table's generators are correct is done in run_ecmult_pre_g.
     */
    secp256k1_gej g2;
    secp256k1_ge p, q, gg;
    secp256k1_fe dpx, dpy, dqx, dqy;
    size_t i;

    CHECK(0 < n);

    secp256k1_ge_from_storage(&p, &pre_g[0]);
    CHECK(secp256k1_ge_is_valid_var(&p));

    secp256k1_gej_set_ge(&g2, &p);
    secp256k1_gej_double_var(&g2, &g2, NULL);
    secp256k1_ge_set_gej_var(&gg, &g2);
    for (i = 1; i < n; ++i) {
        secp256k1_fe_negate(&dpx, &p.x, 1); secp256k1_fe_add(&dpx, &gg.x); secp256k1_fe_normalize_weak(&dpx);
        secp256k1_fe_negate(&dpy, &p.y, 1); secp256k1_fe_add(&dpy, &gg.y); secp256k1_fe_normalize_weak(&dpy);
        /* Check that p is not equal to gg */
        CHECK(!secp256k1_fe_normalizes_to_zero_var(&dpx) || !secp256k1_fe_normalizes_to_zero_var(&dpy));

        secp256k1_ge_from_storage(&q, &pre_g[i]);
        CHECK(secp256k1_ge_is_valid_var(&q));

        secp256k1_fe_negate(&dqx, &q.x, 1); secp256k1_fe_add(&dqx, &gg.x);
        dqy = q.y; secp256k1_fe_add(&dqy, &gg.y);
        /* Check that -q is not equal to gg */
        CHECK(!secp256k1_fe_normalizes_to_zero_var(&dqx) || !secp256k1_fe_normalizes_to_zero_var(&dqy));

        /* Check that -q is not equal to p */
        CHECK(!secp256k1_fe_equal(&dpx, &dqx) || !secp256k1_fe_equal(&dpy, &dqy));

        /* Check that p, -q and gg are colinear */
        secp256k1_fe_mul(&dpx, &dpx, &dqy);
        secp256k1_fe_mul(&dpy, &dpy, &dqx);
        CHECK(secp256k1_fe_equal(&dpx, &dpy));

        p = q;
    }
}